

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O2

REF_STATUS
ref_node_eliminate_unused_offset
          (REF_INT nglobal,REF_GLOB *sorted_globals,REF_INT nunused,REF_GLOB *sorted_unused)

{
  REF_INT RVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)nglobal;
  if (nglobal < 1) {
    uVar2 = uVar3;
  }
  iVar4 = 0;
  do {
    if (uVar3 == uVar2) {
      return 0;
    }
    lVar5 = (long)iVar4;
    RVar1 = nunused;
    if (nunused < iVar4) {
      RVar1 = iVar4;
    }
    iVar4 = RVar1;
    for (; lVar5 < nunused; lVar5 = lVar5 + 1) {
      if (sorted_globals[uVar3] <= sorted_unused[lVar5]) {
        iVar4 = (int)lVar5;
        break;
      }
    }
    sorted_globals[uVar3] = sorted_globals[uVar3] - (long)iVar4;
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_node_eliminate_unused_offset(REF_INT nglobal,
                                                    REF_GLOB *sorted_globals,
                                                    REF_INT nunused,
                                                    REF_GLOB *sorted_unused) {
  REF_INT offset;
  REF_INT i;
  offset = 0;
  for (i = 0; i < nglobal; i++) {
    while ((offset < nunused) && (sorted_unused[offset] < sorted_globals[i])) {
      offset++;
    }
    /* assert there are no unused in global list */
    sorted_globals[i] -= (REF_GLOB)offset;
  }

  return REF_SUCCESS;
}